

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_rbtree.c
# Opt level: O0

void ngx_rbtree_insert_value
               (ngx_rbtree_node_t *temp,ngx_rbtree_node_t *node,ngx_rbtree_node_t *sentinel)

{
  ngx_rbtree_node_t **local_30;
  ngx_rbtree_node_t **p;
  ngx_rbtree_node_t *sentinel_local;
  ngx_rbtree_node_t *node_local;
  ngx_rbtree_node_t *temp_local;
  
  node_local = temp;
  while( true ) {
    if (node->key < node_local->key) {
      local_30 = &node_local->left;
    }
    else {
      local_30 = &node_local->right;
    }
    if (*local_30 == sentinel) break;
    node_local = *local_30;
  }
  *local_30 = node;
  node->parent = node_local;
  node->left = sentinel;
  node->right = sentinel;
  node->color = '\x01';
  return;
}

Assistant:

void
ngx_rbtree_insert_value(ngx_rbtree_node_t *temp, ngx_rbtree_node_t *node,
    ngx_rbtree_node_t *sentinel)
{
    ngx_rbtree_node_t  **p;

    for ( ;; ) {

        p = (node->key < temp->key) ? &temp->left : &temp->right;

        if (*p == sentinel) {
            break;
        }

        temp = *p;
    }

    *p = node;
    node->parent = temp;
    node->left = sentinel;
    node->right = sentinel;
    ngx_rbt_red(node);
}